

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::EnumName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumDescriptor *descriptor)

{
  FileDescriptor *this_00;
  FileDescriptor *file;
  EnumDescriptor *descriptor_00;
  allocator<char> local_89;
  string local_88;
  string local_58;
  undefined1 local_38 [8];
  string name;
  EnumDescriptor *descriptor_local;
  
  name.field_2._8_8_ = this;
  this_00 = EnumDescriptor::file((EnumDescriptor *)this);
  FileClassPrefix_abi_cxx11_((string *)local_38,(objectivec *)this_00,file);
  ClassNameWorker_abi_cxx11_(&local_58,(objectivec *)name.field_2._8_8_,descriptor_00);
  std::__cxx11::string::operator+=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"_Enum",&local_89);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,(string *)local_38,&local_88,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string EnumName(const EnumDescriptor* descriptor) {
  // 1. Enum names are used as is (style calls for CamelCase, trust it).
  // 2. Check for reserved word at the every end and then suffix things.
  //      message Fixed {
  //        message Size {...}
  //        enum Mumble {...}
  //      ...
  //      }
  //    yields Fixed_Class, Fixed_Size.
  string name = FileClassPrefix(descriptor->file());
  name += ClassNameWorker(descriptor);
  return SanitizeNameForObjC(name, "_Enum", NULL);
}